

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonlinear_Buffer.cpp
# Opt level: O3

void __thiscall Nonlinear_Buffer::enable_nonlinearity(Nonlinear_Buffer *this,Nes_Apu *apu,bool b)

{
  int i;
  ulong uVar1;
  undefined7 in_register_00000011;
  Blip_Buffer *pBVar2;
  
  if ((int)CONCAT71(in_register_00000011,b) != 0) {
    (*(this->super_Multi_Buffer)._vptr_Multi_Buffer[7])(this);
  }
  Nes_Nonlinearizer::enable(&this->nonlinearizer,apu,b);
  uVar1 = 0;
  do {
    pBVar2 = &this->buf;
    if (1 < uVar1) {
      pBVar2 = &this->tnd;
    }
    apu->oscs[uVar1]->output = pBVar2;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 5);
  return;
}

Assistant:

void Nonlinear_Buffer::enable_nonlinearity( Nes_Apu& apu, bool b )
{
	if ( b )
		clear();
	nonlinearizer.enable( apu, b );
	for ( int i = 0; i < apu.osc_count; i++ )
		apu.osc_output( i, (i >= 2 ? &tnd : &buf) );
}